

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O2

void __thiscall Diligent::DeviceContextVkImpl::ResetRenderTargets(DeviceContextVkImpl *this)

{
  DeviceContextBase<Diligent::EngineVkImplTraits>::ResetRenderTargets
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this);
  EndRenderScope(this);
  this->m_vkRenderPass = (VkRenderPass)0x0;
  this->m_vkFramebuffer = (VkFramebuffer)0x0;
  std::
  __uniq_ptr_impl<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
  ::reset((__uniq_ptr_impl<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
           *)&this->m_DynamicRenderingInfo,(pointer)0x0);
  (this->m_State).ShadingRateIsSet = false;
  return;
}

Assistant:

void DeviceContextVkImpl::ResetRenderTargets()
{
    TDeviceContextBase::ResetRenderTargets();
    EndRenderScope();
    m_vkRenderPass  = VK_NULL_HANDLE;
    m_vkFramebuffer = VK_NULL_HANDLE;
    m_DynamicRenderingInfo.reset();
    m_State.ShadingRateIsSet = false;
}